

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_data.cpp
# Opt level: O1

void __thiscall
duckdb::StructColumnData::InitializeScanWithOffset
          (StructColumnData *this,ColumnScanState *state,idx_t row_idx)

{
  reference pvVar1;
  reference this_00;
  pointer pCVar2;
  ulong __n;
  bool bVar3;
  reference rVar4;
  
  state->row_index = row_idx;
  state->current = (ColumnSegment *)0x0;
  pvVar1 = vector<duckdb::ColumnScanState,_true>::operator[](&state->child_states,0);
  ColumnData::InitializeScanWithOffset(&(this->validity).super_ColumnData,pvVar1,row_idx);
  if ((this->sub_columns).
      super_vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->sub_columns).
      super_vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 1;
    do {
      rVar4 = vector<bool,_true>::get<true>(&state->scan_child_column,__n - 1);
      if ((*rVar4._M_p & rVar4._M_mask) != 0) {
        this_00 = vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_true>
                  ::operator[](&this->sub_columns,__n - 1);
        pCVar2 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
                 operator->(this_00);
        pvVar1 = vector<duckdb::ColumnScanState,_true>::operator[](&state->child_states,__n);
        (*pCVar2->_vptr_ColumnData[8])(pCVar2,pvVar1,row_idx);
      }
      bVar3 = __n < (ulong)((long)(this->sub_columns).
                                  super_vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
                                  .
                                  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->sub_columns).
                                  super_vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
                                  .
                                  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3);
      __n = __n + 1;
    } while (bVar3);
  }
  return;
}

Assistant:

void StructColumnData::InitializeScanWithOffset(ColumnScanState &state, idx_t row_idx) {
	D_ASSERT(state.child_states.size() == sub_columns.size() + 1);
	state.row_index = row_idx;
	state.current = nullptr;

	// initialize the validity segment
	validity.InitializeScanWithOffset(state.child_states[0], row_idx);

	// initialize the sub-columns
	for (idx_t i = 0; i < sub_columns.size(); i++) {
		if (!state.scan_child_column[i]) {
			continue;
		}
		sub_columns[i]->InitializeScanWithOffset(state.child_states[i + 1], row_idx);
	}
}